

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O1

void __thiscall Assimp::LWS::Element::Parse(Element *this,char **buffer)

{
  int iVar1;
  byte *pbVar2;
  long lVar3;
  char *pcVar4;
  Logger *this_00;
  undefined1 *puVar5;
  list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uStack_98;
  list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_> *local_90;
  Element local_88;
  
  local_90 = &this->children;
  while( true ) {
    this_01 = &local_88.children;
    pbVar2 = (byte *)*buffer;
    while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
    *buffer = (char *)pbVar2;
    uStack_98._7_1_ = *pbVar2;
    if (uStack_98._7_1_ == 0) break;
    if (uStack_98._7_1_ == 0x7b) {
      pbVar2 = pbVar2 + 1;
      *buffer = (char *)pbVar2;
      for (; (*pbVar2 == 0x20 || (*pbVar2 == 9)); pbVar2 = pbVar2 + 1) {
      }
      *buffer = (char *)pbVar2;
    }
    else if (uStack_98._7_1_ == 0x7d) {
      return;
    }
    lVar3 = 0x10;
    do {
      puVar5 = (undefined1 *)((long)&local_88.tokens[0]._M_dataplus._M_p + lVar3);
      *(undefined1 **)((long)&uStack_98 + lVar3) = puVar5;
      *(undefined8 *)((long)local_88.tokens + lVar3 + -8) = 0;
      *puVar5 = 0;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x50);
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node._M_size = 0;
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_01;
    local_88.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
    std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::
    _M_insert<Assimp::LWS::Element>(local_90,(iterator)local_90,&local_88);
    std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::_M_clear
              (&this_01->
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
    lVar3 = -0x40;
    paVar6 = &local_88.tokens[1].field_2;
    do {
      if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar6->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                        paVar6->_M_allocated_capacity + 1);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar6->_M_allocated_capacity + -4);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    pbVar2 = (byte *)*buffer;
    while ((0x20 < (ulong)*pbVar2 || ((0x100003601U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))) {
      pbVar2 = pbVar2 + 1;
      *buffer = (char *)pbVar2;
    }
    paVar6 = &local_88.tokens[0].field_2;
    local_88.tokens[0]._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
    std::__cxx11::string::operator=
              ((string *)
               ((this->children).
                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                _M_impl._M_node.super__List_node_base._M_prev + 1),(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.tokens[0]._M_dataplus._M_p != paVar6) {
      operator_delete(local_88.tokens[0]._M_dataplus._M_p,
                      local_88.tokens[0].field_2._M_allocated_capacity + 1);
    }
    for (pcVar4 = *buffer; (*pcVar4 == ' ' || (*pcVar4 == '\t')); pcVar4 = pcVar4 + 1) {
    }
    *buffer = pcVar4;
    iVar1 = std::__cxx11::string::compare
                      ((char *)((this->children).
                                super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1));
    if (iVar1 == 0) {
      this_00 = DefaultLogger::get();
      Logger::debug(this_00,"LWS: Skipping over plugin-specific data");
      pbVar2 = (byte *)*buffer;
      while( true ) {
        while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
          pbVar2 = pbVar2 + 1;
        }
        *buffer = (char *)pbVar2;
        if ((*pbVar2 == 0) || (iVar1 = strncmp((char *)pbVar2,"EndPlugin",9), iVar1 == 0)) break;
        while ((0xd < *pbVar2 || ((0x2401U >> (*pbVar2 & 0x1f) & 1) == 0))) {
          pbVar2 = pbVar2 + 1;
        }
        for (; (*pbVar2 == 0xd || (*pbVar2 == 10)); pbVar2 = pbVar2 + 1) {
        }
        *buffer = (char *)pbVar2;
      }
    }
    else {
      pbVar2 = (byte *)*buffer;
      while ((0xd < *pbVar2 || ((0x3401U >> (*pbVar2 & 0x1f) & 1) == 0))) {
        pbVar2 = pbVar2 + 1;
        *buffer = (char *)pbVar2;
      }
      paVar6 = &local_88.tokens[0].field_2;
      local_88.tokens[0]._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
      std::__cxx11::string::operator=
                ((string *)
                 ((this->children).
                  super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
                  _M_impl._M_node.super__List_node_base._M_prev + 3),(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.tokens[0]._M_dataplus._M_p != paVar6) {
        operator_delete(local_88.tokens[0]._M_dataplus._M_p,
                        local_88.tokens[0].field_2._M_allocated_capacity + 1);
      }
      if (uStack_98._7_1_ == 0x7b) {
        Parse((Element *)
              ((this->children).
               super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl
               ._M_node.super__List_node_base._M_prev + 1),buffer);
      }
    }
    pbVar2 = (byte *)*buffer;
    while ((0xd < *pbVar2 || ((0x2401U >> (*pbVar2 & 0x1f) & 1) == 0))) {
      pbVar2 = pbVar2 + 1;
    }
    for (; (*pbVar2 == 0xd || (*pbVar2 == 10)); pbVar2 = pbVar2 + 1) {
    }
    *buffer = (char *)pbVar2;
  }
  return;
}

Assistant:

void LWS::Element::Parse (const char*& buffer)
{
    for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {

        // begin of a new element with children
        bool sub = false;
        if (*buffer == '{') {
            ++buffer;
            SkipSpaces(&buffer);
            sub = true;
        }
        else if (*buffer == '}')
            return;

        children.push_back(Element());

        // copy data line - read token per token

        const char* cur = buffer;
        while (!IsSpaceOrNewLine(*buffer)) ++buffer;
        children.back().tokens[0] = std::string(cur,(size_t) (buffer-cur));
        SkipSpaces(&buffer);

        if (children.back().tokens[0] == "Plugin")
        {
            ASSIMP_LOG_DEBUG("LWS: Skipping over plugin-specific data");

            // strange stuff inside Plugin/Endplugin blocks. Needn't
            // follow LWS syntax, so we skip over it
            for (;SkipSpacesAndLineEnd(&buffer);SkipLine(&buffer)) {
                if (!::strncmp(buffer,"EndPlugin",9)) {
                    //SkipLine(&buffer);
                    break;
                }
            }
            continue;
        }

        cur = buffer;
        while (!IsLineEnd(*buffer)) ++buffer;
        children.back().tokens[1] = std::string(cur,(size_t) (buffer-cur));

        // parse more elements recursively
        if (sub)
            children.back().Parse(buffer);
    }
}